

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall
CFGTest_ReachingDefinitionsIf_Test::TestBody(CFGTest_ReachingDefinitionsIf_Test *this)

{
  Function *func;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar1;
  char *message;
  Name NVar2;
  undefined1 local_678 [8];
  Module wasm;
  ReachingDefinitionsTransferFunction transferFunction;
  Locations locations;
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  analyzer;
  GetSetsMap getSetsMap;
  LocalGet *getA1;
  GetSetsMap expectedResult;
  CFG cfg;
  FindAll<wasm::LocalSet> foundSets;
  FindAll<wasm::LocalGet> foundGets;
  LocalSet *local_58;
  LocalSet *setB;
  LocalSet *setA2;
  LocalGet *getB;
  LocalGet *getA2;
  LocalSet *setA1;
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  ::wasm::Module::Module((Module *)local_678);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,
             "\n    (module\n      (func $bar\n        (local $a i32)\n        (local $b i32)\n        (local.set $a\n          (i32.const 1)\n        )\n        (if\n          (i32.eq\n            (local.get $a)\n            (i32.const 2)\n          )\n          (then\n            (local.set $b\n              (i32.const 3)\n            )\n          )\n          (else\n            (local.set $a\n              (i32.const 4)\n            )\n          )\n        )\n        (drop\n          (local.get $b)\n        )\n        (drop\n          (local.get $a)\n        )\n      )\n    )\n  "
             ,(allocator<char> *)
              &analyzer.states.
               super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PrintTest::parseWast
            (&this->super_CFGTest,(Module *)local_678,(string *)&wasm.tagsMap._M_h._M_single_bucket)
  ;
  std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Name::Name((Name *)&foundGets.list.
                              super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"bar");
  NVar2.super_IString.str._M_str =
       (char *)foundGets.list.
               super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  NVar2.super_IString.str._M_len = (size_t)local_678;
  func = (Function *)::wasm::Module::getFunction(NVar2);
  ::wasm::analysis::CFG::fromFunction((Function *)&expectedResult._M_h._M_single_bucket);
  analyzer.states.
  super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&getSetsMap._M_h._M_rehash_policy._M_next_resize;
  getSetsMap._M_h._M_buckets = (__buckets_ptr)0x1;
  getSetsMap._M_h._M_bucket_count = 0;
  getSetsMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  getSetsMap._M_h._M_element_count._0_4_ = 0x3f800000;
  getSetsMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  getSetsMap._M_h._M_rehash_policy._4_4_ = 0;
  getSetsMap._M_h._M_rehash_policy._M_next_resize = 0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&locations;
  locations._M_t._M_impl._0_4_ = 0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       locations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  ::wasm::analysis::ReachingDefinitionsTransferFunction::ReachingDefinitionsTransferFunction
            ((ReachingDefinitionsTransferFunction *)&wasm.tagsMap._M_h._M_single_bucket,func,
             (GetSetsMap *)
             &analyzer.states.
              super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Locations *)&transferFunction.lattice.memberIndices._M_h._M_single_bucket);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::MonotoneCFGAnalyzer
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&locations._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (FinitePowersetLattice<wasm::LocalSet_*> *)
             &transferFunction.fakeSetPtrs._M_h._M_single_bucket,
             (ReachingDefinitionsTransferFunction *)&wasm.tagsMap._M_h._M_single_bucket,
             (CFG *)&expectedResult._M_h._M_single_bucket);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::evaluateFunctionEntry
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&locations._M_t._M_impl.super__Rb_tree_header._M_node_count,func);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::evaluateAndCollectResults
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&locations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)&cfg.field_0x10,func->body);
  ::wasm::FindAll<wasm::LocalGet>::FindAll
            ((FindAll<wasm::LocalGet> *)
             &foundSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,func->body);
  getSetsMap._M_h._M_single_bucket =
       (__node_base_ptr)
       *foundSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  setA2 = foundSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[1];
  getB = (LocalGet *)
         foundSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage[2];
  getA2 = *(LocalGet **)cfg._16_8_;
  local_58 = *(LocalSet **)(cfg._16_8_ + 8);
  setB = *(LocalSet **)(cfg._16_8_ + 0x10);
  getA1 = (LocalGet *)&expectedResult._M_h._M_rehash_policy._M_next_resize;
  expectedResult._M_h._M_buckets = (__buckets_ptr)0x1;
  expectedResult._M_h._M_bucket_count = 0;
  expectedResult._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  expectedResult._M_h._M_element_count._0_4_ = 0x3f800000;
  expectedResult._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  expectedResult._M_h._M_rehash_policy._4_4_ = 0;
  expectedResult._M_h._M_rehash_policy._M_next_resize = 0;
  pSVar1 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&getA1,(key_type *)&getSetsMap._M_h._M_single_bucket)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar1,(LocalSet **)&getA2);
  pSVar1 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&getA1,(key_type *)&setA2)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  setA1 = (LocalSet *)0x0;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar1,&setA1);
  pSVar1 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&getA1,(key_type *)&setA2)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar1,&local_58);
  pSVar1 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&getA1,&getB)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar1,(LocalSet **)&getA2);
  pSVar1 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&getA1,&getB)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar1,&setB);
  testing::internal::
  CmpHelperEQ<std::unordered_map<wasm::LocalGet*,wasm::SmallSet<wasm::LocalSet*,2ul>,std::hash<wasm::LocalGet*>,std::equal_to<wasm::LocalGet*>,std::allocator<std::pair<wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>>>,std::unordered_map<wasm::LocalGet*,wasm::SmallSet<wasm::LocalSet*,2ul>,std::hash<wasm::LocalGet*>,std::equal_to<wasm::LocalGet*>,std::allocator<std::pair<wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>>>>
            ((internal *)&setA1,"expectedResult","getSetsMap",
             (unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)&getA1,
             (unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)&analyzer.states.
                 super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((char)setA1 == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cfg.cpp"
               ,400,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::
  _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&getA1);
  std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
             &foundSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&cfg.field_0x10);
  std::
  vector<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
  ::~vector((vector<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
             *)&analyzer.cfg);
  ::wasm::analysis::ReachingDefinitionsTransferFunction::~ReachingDefinitionsTransferFunction
            ((ReachingDefinitionsTransferFunction *)&wasm.tagsMap._M_h._M_single_bucket);
  std::
  _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_**>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_**>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
               *)&transferFunction.lattice.memberIndices._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&analyzer.states.
                    super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
            ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
             &expectedResult._M_h._M_single_bucket);
  ::wasm::Module::~Module((Module *)local_678);
  return;
}

Assistant:

TEST_F(CFGTest, ReachingDefinitionsIf) {
  auto moduleText = R"wasm(
    (module
      (func $bar
        (local $a i32)
        (local $b i32)
        (local.set $a
          (i32.const 1)
        )
        (if
          (i32.eq
            (local.get $a)
            (i32.const 2)
          )
          (then
            (local.set $b
              (i32.const 3)
            )
          )
          (else
            (local.set $a
              (i32.const 4)
            )
          )
        )
        (drop
          (local.get $b)
        )
        (drop
          (local.get $a)
        )
      )
    )
  )wasm";

  Module wasm;
  parseWast(wasm, moduleText);

  Function* func = wasm.getFunction("bar");
  CFG cfg = CFG::fromFunction(func);

  LocalGraph::GetSetsMap getSetsMap;
  LocalGraph::Locations locations;
  ReachingDefinitionsTransferFunction transferFunction(
    func, getSetsMap, locations);

  MonotoneCFGAnalyzer<FinitePowersetLattice<LocalSet*>,
                      ReachingDefinitionsTransferFunction>
    analyzer(transferFunction.lattice, transferFunction, cfg);
  analyzer.evaluateFunctionEntry(func);
  analyzer.evaluateAndCollectResults();

  FindAll<LocalSet> foundSets(func->body);
  FindAll<LocalGet> foundGets(func->body);

  LocalGet* getA1 = foundGets.list[0];
  LocalGet* getB = foundGets.list[1];
  LocalGet* getA2 = foundGets.list[2];
  LocalSet* setA1 = foundSets.list[0];
  LocalSet* setB = foundSets.list[1];
  LocalSet* setA2 = foundSets.list[2];

  LocalGraph::GetSetsMap expectedResult;
  expectedResult[getA1].insert(setA1);
  expectedResult[getB].insert(nullptr);
  expectedResult[getB].insert(setB);
  expectedResult[getA2].insert(setA1);
  expectedResult[getA2].insert(setA2);

  EXPECT_EQ(expectedResult, getSetsMap);
}